

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

bool __thiscall kj::UnixEventPort::processEpollEvents(UnixEventPort *this,epoll_event *events,int n)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  OwnFd **ppOVar4;
  TimePoint newTime;
  bool local_189;
  bool local_179;
  FdObserver *observer;
  Fault f_3;
  long *local_150;
  DebugComparison<long_&,_int> local_148;
  bool local_119;
  bool _kjCondition_1;
  Fault f_2;
  SyscallResult local_f4;
  undefined1 auStack_f0 [4];
  SyscallResult _kjSyscallResult_1;
  ssize_t n_2;
  char buffer [16];
  Fault local_c8;
  OwnFd *local_c0;
  OwnFd *_kj_result;
  int tfd;
  Fault f_1;
  long *local_a0;
  DebugComparison<long_&,_int> local_98;
  bool local_6d [8];
  bool _kjCondition;
  Fault local_60;
  Fault f;
  SyscallResult local_3c;
  undefined1 auStack_38 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n_1;
  uint64_t value;
  bool local_1d;
  int i;
  bool woken;
  int n_local;
  epoll_event *events_local;
  UnixEventPort *this_local;
  undefined4 extraout_var;
  
  local_1d = false;
  value._4_4_ = 0;
  do {
    if (n <= value._4_4_) {
      newTime.value.value._0_4_ = (**this->clock->_vptr_MonotonicClock)();
      newTime.value.value._4_4_ = extraout_var;
      TimerImpl::advanceTo(&this->timerImpl,newTime);
      return local_1d;
    }
    if (events[value._4_4_].data.ptr == (void *)0x0) {
      f.exception = (Exception *)auStack_38;
      local_3c = kj::_::Debug::syscall<kj::UnixEventPort::processEpollEvents(epoll_event*,int)::__0>
                           ((anon_class_24_3_1aa4c80a *)&f,true);
      pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_3c);
      if (pvVar3 == (void *)0x0) {
        iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_3c);
        kj::_::Debug::Fault::Fault
                  (&local_60,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x286,iVar2,"n = read(eventFd, &value, sizeof(value))","");
        kj::_::Debug::Fault::fatal(&local_60);
      }
      local_a0 = (long *)kj::_::DebugExpressionStart::operator<<
                                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(long *)auStack_38)
      ;
      f_1.exception._4_4_ = 0;
      kj::_::DebugExpression<long&>::operator<
                (&local_98,(DebugExpression<long&> *)&local_a0,(int *)((long)&f_1.exception + 4));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_98);
      local_179 = bVar1 || _auStack_38 == (char *)0x8;
      local_6d[0] = local_179;
      if (!bVar1 && _auStack_38 != (char *)0x8) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
                  ((Fault *)&stack0xffffffffffffff50,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x287,FAILED,"n < 0 || n == sizeof(value)","_kjCondition,",local_6d);
        kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff50);
      }
      local_1d = true;
    }
    else if (events[value._4_4_].data.ptr == (void *)0x1) {
      local_c0 = kj::_::readMaybe<kj::OwnFd>(&this->timerFd);
      if (local_c0 == (OwnFd *)0x0) {
        kj::_::Debug::Fault::Fault
                  (&local_c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x28d,FAILED,"timerFd != nullptr","");
        kj::_::Debug::Fault::fatal(&local_c8);
      }
      ppOVar4 = mv<kj::OwnFd*>(&local_c0);
      _kj_result._4_4_ = OwnFd::get(*ppOVar4);
      memset(&n_2,0,0x10);
      f_2.exception = (Exception *)auStack_f0;
      local_f4 = kj::_::Debug::syscall<kj::UnixEventPort::processEpollEvents(epoll_event*,int)::__1>
                           ((anon_class_24_3_349a78d3 *)&f_2,true);
      pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_f4);
      if (pvVar3 == (void *)0x0) {
        iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_f4);
        kj::_::Debug::Fault::Fault
                  ((Fault *)&stack0xfffffffffffffee8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x290,iVar2,"n = read(tfd, buffer, sizeof(buffer))","");
        kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffee8);
      }
      local_150 = (long *)kj::_::DebugExpressionStart::operator<<
                                    ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(long *)auStack_f0
                                    );
      f_3.exception._4_4_ = 8;
      kj::_::DebugExpression<long&>::operator==
                (&local_148,(DebugExpression<long&> *)&local_150,(int *)((long)&f_3.exception + 4));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_148);
      local_189 = bVar1 || (long)_auStack_f0 < 0;
      local_119 = local_189;
      if (!bVar1 && (long)_auStack_f0 >= 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
                  ((Fault *)&observer,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x291,FAILED,"n == 8 || n < 0","_kjCondition,",&local_119);
        kj::_::Debug::Fault::fatal((Fault *)&observer);
      }
      this->timerfdIsArmed = false;
    }
    else {
      FdObserver::fire((FdObserver *)events[value._4_4_].data.ptr,(short)events[value._4_4_].events)
      ;
    }
    value._4_4_ = value._4_4_ + 1;
  } while( true );
}

Assistant:

bool UnixEventPort::processEpollEvents(struct epoll_event events[], int n) {
  bool woken = false;

  for (int i = 0; i < n; i++) {
    if (events[i].data.u64 == 0) {
      // Someone called wake() from another thread. Consume the event.
      uint64_t value;
      ssize_t n;
      KJ_NONBLOCKING_SYSCALL(n = read(eventFd, &value, sizeof(value)));
      KJ_ASSERT(n < 0 || n == sizeof(value));

      // We were woken. Need to return true.
      woken = true;
    } else if (events[i].data.u64 == 1) {
      // timerfd fired. We need to clear it by reading it.
      int tfd = KJ_ASSERT_NONNULL(timerFd).get();
      char buffer[16]{};
      ssize_t n;
      KJ_NONBLOCKING_SYSCALL(n = read(tfd, buffer, sizeof(buffer)));
      KJ_ASSERT(n == 8 || n < 0);

      timerfdIsArmed = false;

      // The purpose of this event is just to wake up the event loop when needed. We'll check the
      // timer queue separately, so we don't need to do anything special in response to this event
      // here.
    } else {
      FdObserver* observer = reinterpret_cast<FdObserver*>(events[i].data.ptr);
      observer->fire(events[i].events);
    }
  }

  timerImpl.advanceTo(clock.now());

  return woken;
}